

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O0

void * find_in_curious_dynamic_array
                 (curious_dynamic_array_t *self,void *value,compare_f compare_to_el)

{
  int iVar1;
  void *pvVar2;
  void *el;
  int i;
  compare_f compare_to_el_local;
  void *value_local;
  curious_dynamic_array_t *self_local;
  
  el._4_4_ = 0;
  while( true ) {
    if (self->last_el < el._4_4_) {
      return (void *)0x0;
    }
    pvVar2 = get_from_curious_dynamic_array(self,el._4_4_);
    iVar1 = (*compare_to_el)(value,pvVar2);
    if (iVar1 == 0) break;
    el._4_4_ = el._4_4_ + 1;
  }
  return pvVar2;
}

Assistant:

void* find_in_curious_dynamic_array(curious_dynamic_array_t* self, void* value, compare_f compare_to_el)
{
    for (int i = 0; i <= self->last_el; ++i) {
        void* el = get_from_curious_dynamic_array(self, i);

        if (0 == compare_to_el(value, el)) {
            return el;
        }
    }

    return NULL;
}